

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# htentry.cpp
# Opt level: O2

void __thiscall HotRingInstance::hrHead::reset_counter(hrHead *this)

{
  htEntry *phVar1;
  htEntry *phVar2;
  
  phVar1 = (htEntry *)((ulong)this->head & 0xffffffffffff);
  phVar2 = (htEntry *)((ulong)phVar1 | 0x8000000000000000);
  if (-1 < (long)this->head) {
    phVar2 = phVar1;
  }
  this->head = phVar2;
  return;
}

Assistant:

void hrHead::reset_counter(){
            size_t ptr = reinterpret_cast<size_t>(head);
            bool active = ptr & (1l << 63l);        
            ptr <<= 16;
            ptr >>= 16;
            if(active){
                ptr |= (1l << 63l);
            }
            head = reinterpret_cast<htEntry*>(ptr);
        }